

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::drawListItem
          (QTextDocumentLayoutPrivate *this,QPointF *offset,QPainter *painter,PaintContext *context,
          QTextBlock *bl,QTextCharFormat *selectionFormat)

{
  QAbstractTextDocumentLayout *this_00;
  bool bVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  qreal qVar6;
  qreal qVar7;
  qreal qVar8;
  qreal qVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  LayoutDirection LVar13;
  int iVar14;
  QPaintDevice *pQVar15;
  QTextObject *this_01;
  QTextLayout *this_02;
  QBrush *pQVar16;
  QPen *pQVar17;
  long in_FS_OFFSET;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  QTextLine QVar24;
  QColor QVar25;
  QPointF QVar26;
  QTextLayout layout;
  QTextOption option;
  QBrush brush;
  QFontMetrics fontMetrics;
  QBrush fg;
  double local_1a8;
  QPen local_158 [5];
  QBrush local_130 [3];
  QRectF local_118;
  QBrush local_f0;
  QRectF local_e8;
  undefined1 *local_c8;
  QTextEngine *pQStack_c0;
  QString local_b8;
  QFontMetrics local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractTextDocumentLayout **)
             &(this->super_QAbstractTextDocumentLayoutPrivate).field_0x8;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat((QTextBlock *)local_68);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::charFormat((QTextBlock *)local_78);
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::font((QTextCharFormat *)local_88);
  pQVar15 = QAbstractTextDocumentLayout::paintDevice(this_00);
  if (pQVar15 != (QPaintDevice *)0x0) {
    pQVar15 = QAbstractTextDocumentLayout::paintDevice(this_00);
    QFont::QFont((QFont *)&local_58,(QFont *)local_88,pQVar15);
    uVar4 = local_88._0_8_;
    local_88._0_8_ = local_58.xp;
    local_58.xp = (qreal)uVar4;
    uVar5 = local_88._8_4_;
    local_88._8_4_ = local_58.yp._0_4_;
    local_58.yp = (qreal)CONCAT44(local_58.yp._4_4_,uVar5);
    QFont::~QFont((QFont *)&local_58);
  }
  local_a0.d.d.ptr = (QExplicitlySharedDataPointer<QFontPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics(&local_a0,(QFont *)local_88);
  this_01 = QTextDocument::objectForFormat
                      ((this->super_QAbstractTextDocumentLayoutPrivate).document,
                       (QTextFormat *)local_68);
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextObject::format((QTextObject *)&local_58);
  QTextFormat::toListFormat((QTextFormat *)local_98);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  iVar11 = QTextFormat::intProperty((QTextFormat *)local_98,0x3000);
  local_b8.d.d = (Data *)0x0;
  local_b8.d.ptr = (char16_t *)0x0;
  local_b8.d.size = 0;
  bVar10 = QTextFormat::hasProperty((QTextFormat *)local_68,0x3000);
  if (bVar10) {
    iVar11 = QTextFormat::intProperty((QTextFormat *)local_68,0x3000);
  }
  this_02 = QTextBlock::layout(bl);
  iVar12 = QTextLayout::lineCount(this_02);
  if (iVar12 == 0) {
LAB_004e7acf:
    if ((QFontPrivate *)local_b8.d.d != (QFontPrivate *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
      }
    }
    QTextFormat::~QTextFormat((QTextFormat *)local_98);
    QFontMetrics::~QFontMetrics(&local_a0);
    QFont::~QFont((QFont *)local_88);
    QTextFormat::~QTextFormat((QTextFormat *)local_78);
    QTextFormat::~QTextFormat((QTextFormat *)local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return;
  }
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_c0 = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
  QVar24 = QTextLayout::lineAt(this_02,0);
  pQStack_c0 = QVar24.eng;
  local_c8 = (undefined1 *)CONCAT44(local_c8._4_4_,QVar24.index);
  QVar26 = QTextLayout::position(this_02);
  dVar18 = QVar26.xp + offset->xp;
  dVar20 = QVar26.yp + offset->yp;
  LVar13 = QTextBlock::textDirection(bl);
  local_58.w = -NAN;
  local_58.h = -NAN;
  local_58.xp = -NAN;
  local_58.yp = -NAN;
  QTextLine::naturalTextRect(&local_58,(QTextLine *)&local_c8);
  qVar8 = local_58.yp;
  qVar6 = local_58.xp;
  dVar19 = local_58.w;
  if (LVar13 != RightToLeft) {
    dVar19 = -0.0;
  }
  if (iVar11 + 8U < 5) {
    QTextList::itemText((QString *)&local_58,(QTextList *)this_01,bl);
    qVar9 = local_58.w;
    qVar7 = local_58.xp;
    pcVar3 = local_b8.d.ptr;
    pDVar2 = local_b8.d.d;
    local_58.xp = (qreal)local_b8.d.d;
    local_b8.d.d = (Data *)qVar7;
    local_b8.d.ptr = (char16_t *)local_58.yp;
    local_58.yp = (qreal)pcVar3;
    local_58.w = (qreal)local_b8.d.size;
    local_b8.d.size = (qsizetype)qVar9;
    if ((QFontPrivate *)pDVar2 != (QFontPrivate *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
      }
    }
    iVar12 = QFontMetrics::horizontalAdvance(&local_a0,&local_b8,-1);
    iVar14 = QFontMetrics::height(&local_a0);
    dVar23 = (double)iVar14;
    local_1a8 = (double)iVar12;
  }
  else {
    if (2 < iVar11 + 3U) goto LAB_004e7acf;
    iVar12 = QFontMetrics::lineSpacing(&local_a0);
    dVar23 = (double)(iVar12 / 3);
    local_1a8 = dVar23;
  }
  auVar21._0_8_ = (double)((ulong)dVar18 & 0x8000000000000000 | 0x3fe0000000000000) + dVar18;
  auVar21._8_8_ = (double)((ulong)qVar6 & 0x8000000000000000 | 0x3fe0000000000000) + qVar6;
  auVar22 = maxpd(auVar21,_DAT_006747a0);
  dVar20 = (double)((ulong)dVar20 & 0x8000000000000000 | 0x3fe0000000000000) + dVar20;
  dVar18 = (double)((ulong)qVar8 & 0x8000000000000000 | 0x3fe0000000000000) + qVar8;
  bVar10 = 2147483647.0 < dVar20;
  if (dVar20 <= -2147483648.0) {
    dVar20 = -2147483648.0;
  }
  bVar1 = 2147483647.0 < dVar18;
  if (dVar18 <= -2147483648.0) {
    dVar18 = -2147483648.0;
  }
  local_e8.w = local_1a8;
  local_e8.h = dVar23;
  iVar12 = QFontMetrics::horizontalAdvance(&local_a0,(QChar)0x20);
  local_e8.xp = (qreal)iVar12;
  if (LVar13 == LeftToRight) {
    local_e8.xp = -local_e8.xp - local_1a8;
  }
  iVar12 = QFontMetrics::height(&local_a0);
  local_e8.xp = local_e8.xp +
                (double)(int)(double)(~-(ulong)(2147483647.0 < auVar21._8_8_) & auVar22._8_8_ |
                                     -(ulong)(2147483647.0 < auVar21._8_8_) & 0x41dfffffffc00000) +
                (double)(int)(double)(~-(ulong)(2147483647.0 < auVar21._0_8_) & auVar22._0_8_ |
                                     -(ulong)(2147483647.0 < auVar21._0_8_) & 0x41dfffffffc00000) +
                dVar19;
  local_e8.yp = dVar23 * -0.5 + (double)(iVar12 / 2) +
                (double)(int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar1 & (ulong)dVar18) +
                (double)(int)(double)(-(ulong)bVar10 & 0x41dfffffffc00000 |
                                     ~-(ulong)bVar10 & (ulong)dVar20);
  QPainter::save(painter);
  QPainter::setRenderHint(painter,Antialiasing,true);
  QTextBlock::blockFormat((QTextBlock *)&local_58);
  iVar12 = QTextFormat::intProperty((QTextFormat *)&local_58,0x10a0);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  iVar14 = (int)selectionFormat;
  if (selectionFormat == (QTextCharFormat *)0x0) {
    local_58.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::brushProperty((QTextFormat *)&local_58,(int)local_78);
    bVar10 = QBrush::doCompareEqualStyle((QBrush *)&local_58,NoBrush);
    if (bVar10) {
      pQVar16 = QPalette::brush(&context->palette,Current,Text);
      QBrush::operator=((QBrush *)&local_58,pQVar16);
    }
    QPen::QPen((QPen *)&local_118,(QBrush *)&local_58,0.0,SolidLine,SquareCap,BevelJoin);
    QPainter::setPen(painter,(QPen *)&local_118);
    QPen::~QPen((QPen *)&local_118);
    QBrush::~QBrush((QBrush *)&local_58);
LAB_004e7680:
    local_f0.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar16 = QPalette::brush(&context->palette,Current,Text);
    QBrush::QBrush(&local_f0,pQVar16);
    if (iVar12 == 0) goto LAB_004e795a;
  }
  else {
    QTextFormat::brushProperty((QTextFormat *)&local_118,iVar14);
    QPen::QPen((QPen *)&local_58,(QBrush *)&local_118,0.0,SolidLine,SquareCap,BevelJoin);
    QPainter::setPen(painter,(QPen *)&local_58);
    QPen::~QPen((QPen *)&local_58);
    QBrush::~QBrush((QBrush *)&local_118);
    if (iVar12 == 0) {
      QTextFormat::brushProperty((QTextFormat *)&local_58,iVar14);
      QPainter::fillRect(painter,&local_e8,(QBrush *)&local_58);
      QBrush::~QBrush((QBrush *)&local_58);
      goto LAB_004e7680;
    }
    local_f0.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar16 = QPalette::brush(&context->palette,Current,Text);
    QBrush::QBrush(&local_f0,pQVar16);
  }
  iVar12 = QFontMetrics::lineSpacing(&local_a0);
  dVar19 = (double)(iVar12 / 6);
  local_118.h = (qreal)-(iVar12 / 6);
  local_e8.xp = local_118.h + local_e8.xp;
  local_e8.yp = local_e8.yp + 0.0;
  local_e8.w = local_e8.w + 0.0;
  local_e8.h = local_e8.h + 0.0;
  local_118.xp = local_e8.xp + local_118.h;
  local_118.yp = local_e8.yp + local_118.h;
  local_118.w = (dVar19 + local_e8.w) - local_118.h;
  local_118.h = (dVar19 + local_e8.h) - local_118.h;
  if (selectionFormat != (QTextCharFormat *)0x0) {
    QTextFormat::brushProperty((QTextFormat *)&local_58,iVar14);
    QPainter::fillRect(painter,&local_118,(QBrush *)&local_58);
    QBrush::~QBrush((QBrush *)&local_58);
  }
  QTextBlock::blockFormat((QTextBlock *)&local_58);
  iVar12 = QTextFormat::intProperty((QTextFormat *)&local_58,0x10a0);
  QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  if (iVar12 == 2) {
    pQVar17 = QPainter::pen(painter);
    QVar25 = QPen::color(pQVar17);
    local_58.xp = QVar25._0_8_;
    local_58.yp._0_6_ = QVar25.ct._4_6_;
    QBrush::QBrush(local_130,(QColor *)&local_58,SolidPattern);
    QPen::QPen(local_158,local_130,2.0,SolidLine,SquareCap,BevelJoin);
    QPainter::setPen(painter,local_158);
    QPen::~QPen(local_158);
    QBrush::~QBrush(local_130);
    local_58.w = local_e8.w + local_e8.xp;
    local_58.h = local_e8.h + local_e8.yp;
    local_58.xp = local_e8.xp;
    local_58.yp = local_e8.yp;
    QPainter::drawLines(painter,(QLineF *)&local_58,1);
    local_58.xp = local_e8.w + local_e8.xp;
    local_58.h = local_e8.h + local_e8.yp;
    local_58.yp = local_e8.yp;
    local_58.w = local_e8.xp;
    QPainter::drawLines(painter,(QLineF *)&local_58,1);
    pQVar17 = QPainter::pen(painter);
    QVar25 = QPen::color(pQVar17);
    local_58.xp = QVar25._0_8_;
    local_58.yp._0_6_ = QVar25.ct._4_6_;
    QBrush::QBrush(local_130,(QColor *)&local_58,SolidPattern);
    QPen::QPen(local_158,local_130,0.0,SolidLine,SquareCap,BevelJoin);
    QPainter::setPen(painter,local_158);
    QPen::~QPen(local_158);
    QBrush::~QBrush(local_130);
  }
  QPainter::drawRects(painter,&local_118,1);
LAB_004e795a:
  (*(code *)(&DAT_006ac520 + *(int *)(&DAT_006ac520 + (ulong)(iVar11 + 8U) * 4)))();
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::drawListItem(const QPointF &offset, QPainter *painter,
                                              const QAbstractTextDocumentLayout::PaintContext &context,
                                              const QTextBlock &bl, const QTextCharFormat *selectionFormat) const
{
    Q_Q(const QTextDocumentLayout);
    const QTextBlockFormat blockFormat = bl.blockFormat();
    const QTextCharFormat charFormat = bl.charFormat();
    QFont font(charFormat.font());
    if (q->paintDevice())
        font = QFont(font, q->paintDevice());

    const QFontMetrics fontMetrics(font);
    QTextObject * const object = document->objectForFormat(blockFormat);
    const QTextListFormat lf = object->format().toListFormat();
    int style = lf.style();
    QString itemText;
    QSizeF size;

    if (blockFormat.hasProperty(QTextFormat::ListStyle))
        style = QTextListFormat::Style(blockFormat.intProperty(QTextFormat::ListStyle));

    QTextLayout *layout = bl.layout();
    if (layout->lineCount() == 0)
        return;
    QTextLine firstLine = layout->lineAt(0);
    Q_ASSERT(firstLine.isValid());
    QPointF pos = (offset + layout->position()).toPoint();
    Qt::LayoutDirection dir = bl.textDirection();
    {
        QRectF textRect = firstLine.naturalTextRect();
        pos += textRect.topLeft().toPoint();
        if (dir == Qt::RightToLeft)
            pos.rx() += textRect.width();
    }

    switch (style) {
    case QTextListFormat::ListDecimal:
    case QTextListFormat::ListLowerAlpha:
    case QTextListFormat::ListUpperAlpha:
    case QTextListFormat::ListLowerRoman:
    case QTextListFormat::ListUpperRoman:
        itemText = static_cast<QTextList *>(object)->itemText(bl);
        size.setWidth(fontMetrics.horizontalAdvance(itemText));
        size.setHeight(fontMetrics.height());
        break;

    case QTextListFormat::ListSquare:
    case QTextListFormat::ListCircle:
    case QTextListFormat::ListDisc:
        size.setWidth(fontMetrics.lineSpacing() / 3);
        size.setHeight(size.width());
        break;

    case QTextListFormat::ListStyleUndefined:
        return;
    default: return;
    }

    QRectF r(pos, size);

    qreal xoff = fontMetrics.horizontalAdvance(u' ');
    if (dir == Qt::LeftToRight)
        xoff = -xoff - size.width();
    r.translate( xoff, (fontMetrics.height() / 2) - (size.height() / 2));

    painter->save();

    painter->setRenderHint(QPainter::Antialiasing);

    const bool marker = bl.blockFormat().marker() != QTextBlockFormat::MarkerType::NoMarker;
    if (selectionFormat) {
        painter->setPen(QPen(selectionFormat->foreground(), 0));
        if (!marker)
            painter->fillRect(r, selectionFormat->background());
    } else {
        QBrush fg = charFormat.foreground();
        if (fg == Qt::NoBrush)
            fg = context.palette.text();
        painter->setPen(QPen(fg, 0));
    }

    QBrush brush = context.palette.brush(QPalette::Text);

    if (marker) {
        int adj = fontMetrics.lineSpacing() / 6;
        r.adjust(-adj, 0, -adj, 0);
        const QRectF outer = r.adjusted(-adj, -adj, adj, adj);
        if (selectionFormat)
            painter->fillRect(outer, selectionFormat->background());
        if (bl.blockFormat().marker() == QTextBlockFormat::MarkerType::Checked) {
            // ### Qt7: render with QStyle / PE_IndicatorCheckBox. We don't currently
            // have access to that here, because it would be a widget dependency.
            painter->setPen(QPen(painter->pen().color(), 2));
            painter->drawLine(r.topLeft(), r.bottomRight());
            painter->drawLine(r.topRight(), r.bottomLeft());
            painter->setPen(QPen(painter->pen().color(), 0));
        }
        painter->drawRect(outer);
    }

    switch (style) {
    case QTextListFormat::ListDecimal:
    case QTextListFormat::ListLowerAlpha:
    case QTextListFormat::ListUpperAlpha:
    case QTextListFormat::ListLowerRoman:
    case QTextListFormat::ListUpperRoman: {
        QTextLayout layout(itemText, font, q->paintDevice());
        layout.setCacheEnabled(true);
        QTextOption option(Qt::AlignLeft | Qt::AlignAbsolute);
        option.setTextDirection(dir);
        layout.setTextOption(option);
        layout.beginLayout();
        QTextLine line = layout.createLine();
        if (line.isValid())
            line.setLeadingIncluded(true);
        layout.endLayout();
        layout.draw(painter, QPointF(r.left(), pos.y()));
        break;
    }
    case QTextListFormat::ListSquare:
        if (!marker)
            painter->fillRect(r, painter->pen().brush());
        break;
    case QTextListFormat::ListCircle:
        if (!marker)
            painter->drawEllipse(r.translated(0.5, 0.5)); // pixel align for sharper rendering
        break;
    case QTextListFormat::ListDisc:
        if (!marker) {
            painter->setBrush(painter->pen().brush());
            painter->setPen(Qt::NoPen);
            painter->drawEllipse(r);
        }
        break;
    case QTextListFormat::ListStyleUndefined:
        break;
    default:
        break;
    }

    painter->restore();
}